

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t __size;
  uchar uVar1;
  uint uVar2;
  char *key;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *__ptr;
  LodePNGDecompressSettings *allocsize;
  ucvector decoded;
  ucvector local_68;
  char *local_50;
  ulong local_48;
  LodePNGDecompressSettings *local_40;
  LodePNGInfo *local_38;
  
  local_68.data = (uchar *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  if (chunkLength < 5) {
    uVar7 = 0x1e;
LAB_0010f649:
    key = (char *)0x0;
  }
  else {
    uVar7 = 1;
    uVar4 = 0;
    do {
      if (data[uVar4] == '\0') break;
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar4 < chunkLength);
    uVar8 = uVar7 - 1;
    uVar5 = uVar7 + 2;
    uVar6 = (ulong)uVar5;
    if (chunkLength <= uVar6) {
      uVar7 = 0x4b;
      goto LAB_0010f649;
    }
    if (uVar7 - 0x51 < 0xffffffb1) {
      uVar7 = 0x59;
      goto LAB_0010f649;
    }
    __size = (ulong)uVar8 + 1;
    local_40 = zlibsettings;
    local_38 = info;
    key = (char *)malloc(__size);
    if (key == (char *)0x0) {
      key = (char *)0x0;
LAB_0010f6ea:
      pcVar3 = (char *)0x0;
      uVar7 = 0x53;
      __ptr = (char *)0x0;
      goto LAB_0010f651;
    }
    key[uVar4] = '\0';
    if (uVar8 != 0) {
      memcpy(key,data,(ulong)uVar8);
    }
    uVar9 = 0;
    if (data[uVar4 + 2] == '\0') {
      if (uVar6 < chunkLength) {
        uVar9 = 0;
        do {
          if (data[uVar6] == '\0') break;
          uVar6 = (ulong)(uVar7 + 3 + uVar9);
          uVar9 = uVar9 + 1;
        } while (uVar6 < chunkLength);
      }
      uVar1 = data[__size];
      pcVar3 = (char *)malloc((ulong)(uVar9 + 1));
      if (pcVar3 != (char *)0x0) {
        pcVar3[uVar9] = '\0';
        if (uVar9 != 0) {
          uVar4 = 0;
          do {
            pcVar3[uVar4] = data[uVar5 + (int)uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        uVar5 = uVar9 + 1 + uVar5;
        uVar4 = (ulong)uVar5;
        uVar7 = 0;
        if (uVar4 < chunkLength) {
          uVar7 = 0;
          do {
            if (data[uVar4] == '\0') break;
            uVar4 = (ulong)(uVar8 + uVar9 + 5 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar4 < chunkLength);
        }
        local_48 = (ulong)(uVar7 + 1);
        local_50 = pcVar3;
        pcVar3 = (char *)malloc(local_48);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)0x0;
LAB_0010f82c:
          uVar7 = 0x53;
          __ptr = local_50;
        }
        else {
          pcVar3[uVar7] = '\0';
          if (uVar7 != 0) {
            uVar4 = 0;
            do {
              pcVar3[uVar4] = data[uVar5 + (int)uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
          uVar5 = (int)local_48 + uVar5;
          uVar10 = (uint)chunkLength;
          uVar2 = uVar10 - uVar5;
          if (uVar10 < uVar5) {
            uVar2 = 0;
          }
          uVar4 = (ulong)uVar2;
          if (uVar1 == '\0') {
            local_40 = (LodePNGDecompressSettings *)(ulong)(uVar2 + 1);
            local_48 = (ulong)uVar5;
            uVar5 = ucvector_reserve(&local_68,(size_t)local_40);
            if (uVar5 == 0) goto LAB_0010f82c;
            local_68.size = (size_t)local_40;
            local_68.data[uVar4] = '\0';
            if ((uint)local_48 < uVar10) {
              uVar6 = 0;
              do {
                local_68.data[uVar6] = data[uVar8 + uVar7 + uVar9 + 5 + (int)uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar4 != uVar6);
            }
          }
          else {
            uVar7 = zlib_decompress(&local_68.data,&local_68.size,data + uVar5,uVar4,local_40);
            __ptr = local_50;
            if (uVar7 != 0) goto LAB_0010f651;
            if (local_68.allocsize < local_68.size) {
              local_68.allocsize = local_68.size;
            }
            allocsize = (LodePNGDecompressSettings *)((long)(uint *)local_68.size + 1);
            uVar7 = ucvector_reserve(&local_68,(size_t)allocsize);
            if (uVar7 != 0) {
              (local_68.data + -1)[(long)allocsize] = '\0';
              local_68.size = (size_t)allocsize;
            }
          }
          __ptr = local_50;
          uVar7 = lodepng_add_itext(local_38,key,local_50,pcVar3,(char *)local_68.data);
        }
        goto LAB_0010f651;
      }
      goto LAB_0010f6ea;
    }
    uVar7 = 0x48;
  }
  pcVar3 = (char *)0x0;
  __ptr = (char *)0x0;
LAB_0010f651:
  free(key);
  free(__ptr);
  free(pcVar3);
  local_68.size = 0;
  local_68.allocsize = 0;
  free(local_68.data);
  return uVar7;
}

Assistant:

static void ucvector_init(ucvector* p)
{
  p->data = NULL;
  p->size = p->allocsize = 0;
}